

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<IntrusiveListIteratorTest_crbegin_crend_backward_Test>::
CreateTest(TestFactoryImpl<IntrusiveListIteratorTest_crbegin_crend_backward_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<IntrusiveListIteratorTest_crbegin_crend_backward_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x30);
  IntrusiveListIteratorTest_crbegin_crend_backward_Test::
  IntrusiveListIteratorTest_crbegin_crend_backward_Test
            ((IntrusiveListIteratorTest_crbegin_crend_backward_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }